

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system_catalog.cpp
# Opt level: O2

ssize_t __thiscall SystemCatalog::write(SystemCatalog *this,int __fd,void *__buf,size_t __n)

{
  uint uVar1;
  _Rb_tree_node_base *p_Var2;
  _Base_ptr p_Var3;
  type k;
  
  writeNumTypes(this);
  p_Var2 = (_Rb_tree_node_base *)std::ostream::seekp(&this->field_0x48,4,0);
  p_Var3 = (this->types)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  while ((_Rb_tree_header *)p_Var3 != &(this->types)._M_t._M_impl.super__Rb_tree_header) {
    type::type(&k,(type *)(p_Var3 + 1));
    uVar1 = std::ostream::tellp();
    type::write(&k,(int)this + 0x38,(void *)(ulong)uVar1,__n);
    type::~type(&k);
    p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var3);
    p_Var3 = p_Var2;
  }
  return (ssize_t)p_Var2;
}

Assistant:

void SystemCatalog::write() {

    writeNumTypes();

    catalogFile.seekp(NUM_TYPES);

    for (auto k: types) {
        k.write(catalogFile, (int) catalogFile.tellp());
    }
}